

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O1

void __thiscall Runner::HandleParamBlock(Runner *this,ParamBlock *block,bool isConfigs)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  ushort uVar5;
  ushort uVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  undefined7 in_register_00000011;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar2 = block->numParams;
  uVar5 = block->startIdx << 8 | block->startIdx >> 8;
  uVar6 = uVar2 << 8 | uVar2 >> 8;
  if ((int)CONCAT71(in_register_00000011,isConfigs) != 0) {
    if ((ulong)((long)(this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) < (ulong)((uint)uVar6 + (uint)uVar5)) {
      CLI::std::vector<int,_std::allocator<int>_>::resize
                (&this->m_CurrConfigs,(ulong)((uint)uVar6 + (uint)uVar5));
    }
    if (isConfigs) goto LAB_00128954;
  }
  if ((ulong)((long)(this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < (ulong)((uint)uVar6 + (uint)uVar5)) {
    CLI::std::vector<int,_std::allocator<int>_>::resize
              (&this->m_CurrStatuses,(ulong)((uint)uVar6 + (uint)uVar5));
  }
LAB_00128954:
  if (s_JSONOutput == true) {
    pcVar10 = "\"status\": {";
    if (isConfigs) {
      pcVar10 = "\"config\": {";
    }
    puts(pcVar10);
  }
  if (uVar2 != 0) {
    uVar12 = (uint)uVar5;
    p_Var1 = &(this->m_TemperatureStatusIndices)._M_t._M_impl.super__Rb_tree_header;
    bVar4 = false;
    uVar11 = (ulong)uVar12;
    do {
      uVar2 = *(ushort *)((long)block + (uVar11 - uVar12) * 2 + 4);
      if (uVar2 != 0x55aa) {
        uVar9 = (uint)(short)(uVar2 << 8 | uVar2 >> 8);
        if (isConfigs) {
          (this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = uVar9;
          if (s_JSONOutput == true) {
            if (bVar4) {
              puts(",");
            }
            printf("\"%d\" : %d",uVar11 & 0xffffffff,(ulong)uVar9);
LAB_00128b4d:
            bVar4 = true;
          }
          else {
            pcVar10 = "/home/alsavo/config/%d={\"type\":\"config\", \"index\":%d, \"value\":%d}\n";
LAB_00128b5c:
            printf(pcVar10,uVar11 & 0xffffffff,uVar11 & 0xffffffff,(ulong)uVar9);
          }
        }
        else {
          (this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = uVar9;
          if (s_JSONOutput == true) {
            if (bVar4) {
              puts(",");
            }
            printf("\"%d\" : ",uVar11 & 0xffffffff);
            p_Var3 = (this->m_TemperatureStatusIndices)._M_t._M_impl.super__Rb_tree_header._M_header
                     ._M_parent;
            p_Var7 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
                p_Var3 = (&p_Var3->_M_left)[(long)(int)*(size_t *)(p_Var3 + 1) < (long)uVar11]) {
              if ((long)uVar11 <= (long)(int)*(size_t *)(p_Var3 + 1)) {
                p_Var7 = p_Var3;
              }
            }
            p_Var8 = p_Var1;
            if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
               (p_Var8 = (_Rb_tree_header *)p_Var7,
               (long)uVar11 < (long)(int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
              p_Var8 = p_Var1;
            }
            if (p_Var8 == p_Var1) {
              printf("%d",(ulong)uVar9);
              goto LAB_00128b4d;
            }
            bVar4 = true;
            printf("%.1f",(double)((float)(int)uVar9 / 10.0));
          }
          else {
            p_Var3 = (this->m_TemperatureStatusIndices)._M_t._M_impl.super__Rb_tree_header._M_header
                     ._M_parent;
            p_Var7 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
                p_Var3 = (&p_Var3->_M_left)[(long)(int)*(size_t *)(p_Var3 + 1) < (long)uVar11]) {
              if ((long)uVar11 <= (long)(int)*(size_t *)(p_Var3 + 1)) {
                p_Var7 = p_Var3;
              }
            }
            p_Var8 = p_Var1;
            if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
               (p_Var8 = (_Rb_tree_header *)p_Var7,
               (long)uVar11 < (long)(int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
              p_Var8 = p_Var1;
            }
            if (p_Var8 == p_Var1) {
              pcVar10 = "/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%d}\n"
              ;
              goto LAB_00128b5c;
            }
            printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%.1f}\n",
                   (double)((float)(int)uVar9 / 10.0),uVar11 & 0xffffffff,uVar11 & 0xffffffff);
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar6 + uVar12);
  }
  if (s_JSONOutput != false) {
    printf("\n}");
    if (!isConfigs) {
      putchar(0x2c);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void HandleParamBlock(ParamBlock* block, bool isConfigs)
	{
		int startIdx = ntohs(block->startIdx);
		int numParams = ntohs(block->numParams);
		if (isConfigs && numParams + startIdx > m_CurrConfigs.size())
			m_CurrConfigs.resize(numParams + startIdx);
		if (!isConfigs && numParams + startIdx > m_CurrStatuses.size())
			m_CurrStatuses.resize(numParams + startIdx);

		if(s_JSONOutput)
		{
			// Header
			if(isConfigs)
				printf("\"config\": {\n");
			else
				printf("\"status\": {\n");
		}

		bool hasPrev = false;
		for (int i = startIdx; i < startIdx + numParams; ++i)
		{
			int16_t valInt = ntohs(block->payload[i - startIdx]);
			if (valInt == -21931)
				continue;
			if(isConfigs)
			{
				m_CurrConfigs[i] = valInt;
				if(s_JSONOutput)
				{
					if(hasPrev)
						printf(",\n");
					printf("\"%d\" : %d", i, valInt);
					hasPrev = true;
				}
				else
				{
					printf("/home/alsavo/config/%d={\"type\":\"config\", \"index\":%d, \"value\":%d}\n",i, i, valInt);
				}
			}
			else
			{
				m_CurrStatuses[i] = valInt;
				if(s_JSONOutput)
				{
					if(hasPrev)
						printf(",\n");
					printf("\"%d\" : ", i);
					if (m_TemperatureStatusIndices.find(i) != m_TemperatureStatusIndices.end())
					{
						float fval = ((float)valInt) / 10.0f;
						printf("%.1f", fval);
					}
					else
						printf("%d", valInt);
					
					hasPrev = true;


				}
				else
				{
					if (m_TemperatureStatusIndices.find(i) != m_TemperatureStatusIndices.end())
					{
						float fval = ((float)valInt) / 10.0f;
						printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%.1f}\n", i, i, fval);
					}
					else
						printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%d}\n", i, i, valInt);
				}
			}
		}
		if(s_JSONOutput)
		{
			printf("\n}");
			if(!isConfigs) // Status is printed out first
				printf(",");
			printf("\n");
		}

	}